

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O2

TsdlAttr * __thiscall
yactfr::internal::TsdlParser::_expectAttr(TsdlAttr *__return_storage_ptr__,TsdlParser *this)

{
  ulong uVar1;
  string msg;
  string msg_00;
  string msg_01;
  TextLocation loc;
  TextLocation loc_00;
  TextLocation loc_01;
  type tVar2;
  type tVar3;
  bool bVar4;
  allocator aVar5;
  string *psVar6;
  reference_const_type puVar7;
  ulong *puVar8;
  reference_type pTVar9;
  Index IVar10;
  optional<unsigned_long_long> oVar11;
  optional<long_long> oVar12;
  optional<unsigned_long_long> val;
  optional<long_long> val_1;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  allocator in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff41;
  Index in_stack_ffffffffffffff48;
  Index local_b0;
  optional<long_long> local_a8;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  TextLocation local_38;
  
  TsdlAttr::TsdlAttr(__return_storage_ptr__);
  StrScanner::skipCommentsAndWhitespaces<true,true>(&this->_ss);
  StrScanner::loc((TextLocation *)&stack0xffffffffffffff40,&this->_ss);
  tVar2._1_7_ = in_stack_ffffffffffffff41;
  tVar2._0_1_ = in_stack_ffffffffffffff40;
  (__return_storage_ptr__->nameLoc).super_type.m_storage.dummy_.aligner_ = tVar2;
  *(Index *)((long)&(__return_storage_ptr__->nameLoc).super_type.m_storage.dummy_ + 8) =
       in_stack_ffffffffffffff48;
  *(Index *)((long)&(__return_storage_ptr__->nameLoc).super_type.m_storage.dummy_ + 0x10) = local_b0
  ;
  if ((__return_storage_ptr__->nameLoc).super_type.m_initialized == false) {
    (__return_storage_ptr__->nameLoc).super_type.m_initialized = true;
  }
  bVar4 = StrScanner::tryScanToken<true,true>(&this->_ss,"model.emf.uri");
  if (bVar4) {
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->name);
  }
  else {
    psVar6 = StrScanner::tryScanIdent<true,true>(&this->_ss);
    if (psVar6 == (string *)0x0) {
      std::__cxx11::string::string
                (local_58,"Expecting attribute name.",(allocator *)&stack0xffffffffffffff40);
      pTVar9 = boost::optional<yactfr::TextLocation>::get(&__return_storage_ptr__->nameLoc);
      msg.field_2._8_8_ = in_stack_ffffffffffffff30;
      msg._0_24_ = *pTVar9;
      loc._lineNumber._0_1_ = in_stack_ffffffffffffff40;
      loc._offset = in_stack_ffffffffffffff38;
      loc._lineNumber._1_7_ = in_stack_ffffffffffffff41;
      loc._colNumber = in_stack_ffffffffffffff48;
      throwTextParseError(msg,loc);
    }
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
  }
  _expectToken(this,"=");
  StrScanner::skipCommentsAndWhitespaces<true,true>(&this->_ss);
  StrScanner::loc((TextLocation *)&stack0xffffffffffffff40,&this->_ss);
  tVar3._1_7_ = in_stack_ffffffffffffff41;
  tVar3._0_1_ = in_stack_ffffffffffffff40;
  (__return_storage_ptr__->valLoc).super_type.m_storage.dummy_.aligner_ = tVar3;
  *(Index *)((long)&(__return_storage_ptr__->valLoc).super_type.m_storage.dummy_ + 8) =
       in_stack_ffffffffffffff48;
  *(Index *)((long)&(__return_storage_ptr__->valLoc).super_type.m_storage.dummy_ + 0x10) = local_b0;
  if ((__return_storage_ptr__->valLoc).super_type.m_initialized == false) {
    (__return_storage_ptr__->valLoc).super_type.m_initialized = true;
  }
  bVar4 = std::operator==(&__return_storage_ptr__->name,"map");
  if (bVar4) {
    __return_storage_ptr__->kind = ClkNameValue;
    _expectToken(this,"clock");
    _expectToken(this,".");
    psVar6 = StrScanner::tryScanIdent<true,true>(&this->_ss);
    if (psVar6 == (string *)0x0) {
      std::__cxx11::string::string
                (local_78,"Expecting identifier (clock type internal ID).",
                 (allocator *)&stack0xffffffffffffff40);
      StrScanner::loc(&local_38,&this->_ss);
      msg_00._M_string_length = local_38._lineNumber;
      msg_00._M_dataplus._M_p = (pointer)local_38._offset;
      msg_00.field_2._M_allocated_capacity = local_38._colNumber;
      msg_00.field_2._8_8_ = in_stack_ffffffffffffff30;
      loc_00._lineNumber._0_1_ = in_stack_ffffffffffffff40;
      loc_00._offset = in_stack_ffffffffffffff38;
      loc_00._lineNumber._1_7_ = in_stack_ffffffffffffff41;
      loc_00._colNumber = in_stack_ffffffffffffff48;
      throwTextParseError(msg_00,loc_00);
    }
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->strVal);
    _expectToken(this,".");
    _expectToken(this,"value");
  }
  else {
    psVar6 = _tryScanLitStr_abi_cxx11_(this);
    if (psVar6 == (string *)0x0) {
      psVar6 = StrScanner::tryScanIdent<true,true>(&this->_ss);
      if (psVar6 == (string *)0x0) {
        oVar11 = StrScanner::tryScanConstInt<true,true,unsigned_long_long,true>(&this->_ss);
        IVar10 = oVar11.super_type.m_storage;
        aVar5 = (allocator)oVar11.super_type.m_initialized;
        if (((undefined1  [16])oVar11.super_type & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        {
          oVar12 = StrScanner::tryScanConstInt<true,true,long_long,true>(&this->_ss);
          local_a8.super_type.m_storage = oVar12.super_type.m_storage;
          local_a8.super_type.m_initialized = oVar12.super_type.m_initialized;
          if (((undefined1  [16])oVar12.super_type & (undefined1  [16])0x1) == (undefined1  [16])0x0
             ) {
            std::__cxx11::string::string
                      (local_98,"Expecting valid constant integer, literal string, or identifier.",
                       (allocator *)&stack0xffffffffffffff3f);
            pTVar9 = boost::optional<yactfr::TextLocation>::get(&__return_storage_ptr__->valLoc);
            msg_01.field_2._8_8_ = in_stack_ffffffffffffff30;
            msg_01._0_24_ = *pTVar9;
            loc_01._lineNumber._0_1_ = aVar5;
            loc_01._offset = in_stack_ffffffffffffff38;
            loc_01._lineNumber._1_7_ = in_stack_ffffffffffffff41;
            loc_01._colNumber = IVar10;
            throwTextParseError(msg_01,loc_01);
          }
          puVar8 = (ulong *)boost::optional<long_long>::get(&local_a8);
          uVar1 = *puVar8;
          __return_storage_ptr__->intVal = uVar1;
          __return_storage_ptr__->kind = SInt;
          if (uVar1 < 2) {
            __assert_fail("attr.intVal != 0 && attr.intVal != 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/tsdl-parser.cpp"
                          ,0xa69,"TsdlAttr yactfr::internal::TsdlParser::_expectAttr()");
          }
        }
        else {
          puVar7 = boost::optional<unsigned_long_long>::get
                             ((optional<unsigned_long_long> *)&stack0xffffffffffffff40);
          __return_storage_ptr__->uintVal = *puVar7;
          __return_storage_ptr__->kind = UInt;
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->strVal);
        __return_storage_ptr__->kind = Ident;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->strVal);
      __return_storage_ptr__->kind = Str;
    }
  }
  _expectToken(this,";");
  return __return_storage_ptr__;
}

Assistant:

TsdlAttr TsdlParser::_expectAttr()
{
    TsdlAttr attr;

    // parse name
    {
        auto nameIsFound = false;

        _ss.skipCommentsAndWhitespaces();
        attr.nameLoc = _ss.loc();

        if (_ss.tryScanToken("model.emf.uri")) {
            nameIsFound = true;
            attr.name = "model.emf.uri";
        } else if (const auto ident = _ss.tryScanIdent()) {
            nameIsFound = true;
            attr.name = *ident;
        }

        if (!nameIsFound) {
            throwTextParseError("Expecting attribute name.", *attr.nameLoc);
        }
    }

    // parse `=`
    this->_expectToken("=");

    // this it the source location of the attribute for an eventual error
    _ss.skipCommentsAndWhitespaces();
    attr.valLoc = _ss.loc();

    // special case for the `map` attribute
    if (attr.name == "map") {
        attr.kind = TsdlAttr::Kind::ClkNameValue;

        // parse `clock`
        this->_expectToken("clock");

        // parse `.`
        this->_expectToken(".");

        // parse internal ID (name) of clock type
        if (const auto ident = _ss.tryScanIdent()) {
            attr.strVal = *ident;
        } else {
            throwTextParseError("Expecting identifier (clock type internal ID).", _ss.loc());
        }

        // parse `.`
        this->_expectToken(".");

        // parse `value`
        this->_expectToken("value");

        // parse `;`
        this->_expectToken(";");
        return attr;
    }

    if (const auto escapedStr = this->_tryScanLitStr()) {
        // literal string
        attr.strVal = *escapedStr;
        attr.kind = TsdlAttr::Kind::Str;
    } else if (const auto ident = _ss.tryScanIdent()) {
        // identifier
        attr.strVal = *ident;
        attr.kind = TsdlAttr::Kind::Ident;
    } else if (const auto val = _ss.tryScanConstUInt()) {
        // constant unsigned integer
        attr.uintVal = *val;
        attr.kind = TsdlAttr::Kind::UInt;
    } else if (const auto val = _ss.tryScanConstSInt()) {
        // constant signed integer
        attr.intVal = *val;
        attr.kind = TsdlAttr::Kind::SInt;
        assert(attr.intVal != 0 && attr.intVal != 1);
    } else {
        throwTextParseError("Expecting valid constant integer, literal string, or identifier.",
                            *attr.valLoc);
    }

    // parse `;`
    this->_expectToken(";");
    return attr;
}